

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

DeviceAPI * __thiscall
tvm::runtime::DeviceAPIManager::GetAPI(DeviceAPIManager *this,string *name,bool allow_missing)

{
  ostringstream *poVar1;
  ostream *poVar2;
  DeviceAPIManager *local_1f8;
  void *ptr;
  LogMessageFatal local_1e8;
  PackedFunc *local_50;
  PackedFunc *f;
  string factory;
  bool allow_missing_local;
  string *name_local;
  DeviceAPIManager *this_local;
  
  factory.field_2._M_local_buf[0xf] = allow_missing;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f,
                 "device_api.",name);
  local_50 = Registry::Get((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&f);
  if (local_50 == (PackedFunc *)0x0) {
    if ((factory.field_2._M_local_buf[0xf] & 1U) == 0) {
      dmlc::LogMessageFatal::LogMessageFatal
                (&local_1e8,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/c_runtime_api.cc"
                 ,99);
      poVar1 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1e8);
      poVar2 = std::operator<<((ostream *)poVar1,"Check failed: allow_missing");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = std::operator<<(poVar2,"Device API ");
      poVar2 = std::operator<<(poVar2,(string *)name);
      std::operator<<(poVar2," is not enabled.");
      dmlc::LogMessageFatal::~LogMessageFatal(&local_1e8);
    }
    this_local = (DeviceAPIManager *)0x0;
  }
  else {
    PackedFunc::operator()<>((PackedFunc *)&stack0xfffffffffffffdf8);
    this_local = (DeviceAPIManager *)
                 TVMPODValue_::operator_cast_to_void_((TVMPODValue_ *)&stack0xfffffffffffffdf8);
    TVMRetValue::~TVMRetValue((TVMRetValue *)&stack0xfffffffffffffdf8);
    local_1f8 = this_local;
  }
  ptr._4_4_ = 1;
  std::__cxx11::string::~string((string *)&f);
  return (DeviceAPI *)this_local;
}

Assistant:

DeviceAPI *GetAPI(const std::string name, bool allow_missing) {
    std::string factory = "device_api." + name;
    auto *f = Registry::Get(factory);
    if (f == nullptr) {
      CHECK(allow_missing)
          << "Device API " << name << " is not enabled.";
      return nullptr;
    }
    void *ptr = (*f)();
    return static_cast<DeviceAPI *>(ptr);
  }